

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGeneratedFileStream.cxx
# Opt level: O0

int testGeneratedFileStream(int param_1,char **param_2)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  undefined1 local_3b8 [8];
  string file4tmp;
  string file3tmp;
  string file2tmp;
  string file1tmp;
  undefined1 local_330 [8];
  string file4;
  undefined1 local_308 [8];
  string file3;
  undefined1 local_2e0 [8];
  string file2;
  allocator<char> local_2a9;
  undefined1 local_2a8 [8];
  string file1;
  cmGeneratedFileStream gm;
  int failed;
  char **param_1_local;
  int param_0_local;
  
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),None);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2a8,"generatedFile1",&local_2a9);
  std::allocator<char>::~allocator(&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e0,"generatedFile2",
             (allocator<char> *)(file3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(file3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_308,"generatedFile3",
             (allocator<char> *)(file4.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(file4.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_330,"generatedFile4",
             (allocator<char> *)(file1tmp.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(file1tmp.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&file2tmp.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                 ".tmp");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&file3tmp.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                 ".tmp");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&file4tmp.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308,
                 ".tmp");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330,
                 ".tmp");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,pcVar2,&local_3d9);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),&local_3d8,false,false);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::operator<<((ostream *)((long)&file1.field_2 + 8),"This is generated file 1");
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&file1.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,pcVar2,&local_401);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),&local_400,false,false);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::operator<<((ostream *)((long)&file1.field_2 + 8),"This is generated file 2");
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&file1.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,pcVar2,&local_429);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),&local_428,false,false);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::operator<<((ostream *)((long)&file1.field_2 + 8),"This is generated file 3");
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&file1.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,pcVar2,&local_451);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),&local_450,false,false);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::operator<<((ostream *)((long)&file1.field_2 + 8),"This is generated file 4");
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&file1.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileExists(pcVar2);
      if (bVar1) {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::SystemTools::FileExists(pcVar2);
        if (bVar1) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::SystemTools::FileExists(pcVar2);
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
            poVar3 = std::operator<<(poVar3,
                                     "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                    );
            pcVar2 = (char *)std::__cxx11::string::c_str();
            poVar3 = std::operator<<(poVar3,pcVar2);
            std::operator<<(poVar3,"\n");
            gm._612_4_ = 1;
          }
          else {
            pcVar2 = (char *)std::__cxx11::string::c_str();
            bVar1 = cmsys::SystemTools::FileExists(pcVar2);
            if (bVar1) {
              poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
              poVar3 = std::operator<<(poVar3,
                                       "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                      );
              pcVar2 = (char *)std::__cxx11::string::c_str();
              poVar3 = std::operator<<(poVar3,pcVar2);
              std::operator<<(poVar3,"\n");
              gm._612_4_ = 1;
            }
            else {
              pcVar2 = (char *)std::__cxx11::string::c_str();
              bVar1 = cmsys::SystemTools::FileExists(pcVar2);
              if (bVar1) {
                poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
                poVar3 = std::operator<<(poVar3,
                                         "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                        );
                pcVar2 = (char *)std::__cxx11::string::c_str();
                poVar3 = std::operator<<(poVar3,pcVar2);
                std::operator<<(poVar3,"\n");
                gm._612_4_ = 1;
              }
              else {
                pcVar2 = (char *)std::__cxx11::string::c_str();
                gm._612_1_ = cmsys::SystemTools::FileExists(pcVar2);
                if ((bool)gm._612_1_) {
                  poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
                  poVar3 = std::operator<<(poVar3,
                                           "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                          );
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  poVar3 = std::operator<<(poVar3,pcVar2);
                  std::operator<<(poVar3,"\n");
                }
                else {
                  std::operator<<((ostream *)&std::cout,"cmGeneratedFileStream works\n");
                }
                gm._613_3_ = 0;
              }
            }
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
          poVar3 = std::operator<<(poVar3,
                                   "Something wrong with cmGeneratedFileStream. Cannot find file: ")
          ;
          pcVar2 = (char *)std::__cxx11::string::c_str();
          poVar3 = std::operator<<(poVar3,pcVar2);
          std::operator<<(poVar3,"\n");
          gm._612_4_ = 1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
        poVar3 = std::operator<<(poVar3,"Something wrong with cmGeneratedFileStream. Found file: ");
        pcVar2 = (char *)std::__cxx11::string::c_str();
        poVar3 = std::operator<<(poVar3,pcVar2);
        std::operator<<(poVar3,"\n");
        gm._612_4_ = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
      poVar3 = std::operator<<(poVar3,
                               "Something wrong with cmGeneratedFileStream. Cannot find file: ");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      poVar3 = std::operator<<(poVar3,pcVar2);
      std::operator<<(poVar3,"\n");
      gm._612_4_ = 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
    poVar3 = std::operator<<(poVar3,"Something wrong with cmGeneratedFileStream. Cannot find file: "
                            );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3,"\n");
    gm._612_4_ = 1;
  }
  cmsys::SystemTools::RemoveFile((string *)local_2a8);
  cmsys::SystemTools::RemoveFile((string *)local_2e0);
  cmsys::SystemTools::RemoveFile((string *)local_308);
  cmsys::SystemTools::RemoveFile((string *)local_330);
  cmsys::SystemTools::RemoveFile((string *)((long)&file2tmp.field_2 + 8));
  cmsys::SystemTools::RemoveFile((string *)((long)&file3tmp.field_2 + 8));
  cmsys::SystemTools::RemoveFile((string *)((long)&file4tmp.field_2 + 8));
  cmsys::SystemTools::RemoveFile((string *)local_3b8);
  std::__cxx11::string::~string((string *)local_3b8);
  std::__cxx11::string::~string((string *)(file4tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(file3tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(file2tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::~string((string *)local_308);
  std::__cxx11::string::~string((string *)local_2e0);
  std::__cxx11::string::~string((string *)local_2a8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)((long)&file1.field_2 + 8))
  ;
  return gm._612_4_;
}

Assistant:

int testGeneratedFileStream(int /*unused*/, char* /*unused*/ [])
{
  int failed = 0;
  cmGeneratedFileStream gm;
  std::string file1 = "generatedFile1";
  std::string file2 = "generatedFile2";
  std::string file3 = "generatedFile3";
  std::string file4 = "generatedFile4";
  std::string file1tmp = file1 + ".tmp";
  std::string file2tmp = file2 + ".tmp";
  std::string file3tmp = file3 + ".tmp";
  std::string file4tmp = file4 + ".tmp";
  gm.Open(file1.c_str());
  gm << "This is generated file 1";
  gm.Close();
  gm.Open(file2.c_str());
  gm << "This is generated file 2";
  gm.Close();
  gm.Open(file3.c_str());
  gm << "This is generated file 3";
  gm.Close();
  gm.Open(file4.c_str());
  gm << "This is generated file 4";
  gm.Close();
  if (cmSystemTools::FileExists(file1.c_str())) {
    if (cmSystemTools::FileExists(file2.c_str())) {
      if (cmSystemTools::FileExists(file3.c_str())) {
        if (cmSystemTools::FileExists(file4.c_str())) {
          if (cmSystemTools::FileExists(file1tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file1tmp.c_str());
          } else if (cmSystemTools::FileExists(file2tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file2tmp.c_str());
          } else if (cmSystemTools::FileExists(file3tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file3tmp.c_str());
          } else if (cmSystemTools::FileExists(file4tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file4tmp.c_str());
          } else {
            std::cout << "cmGeneratedFileStream works\n";
          }
        } else {
          cmFailed(
            "Something wrong with cmGeneratedFileStream. Cannot find file: ",
            file4.c_str());
        }
      } else {
        cmFailed("Something wrong with cmGeneratedFileStream. Found file: ",
                 file3.c_str());
      }
    } else {
      cmFailed(
        "Something wrong with cmGeneratedFileStream. Cannot find file: ",
        file2.c_str());
    }
  } else {
    cmFailed("Something wrong with cmGeneratedFileStream. Cannot find file: ",
             file1.c_str());
  }
  cmSystemTools::RemoveFile(file1);
  cmSystemTools::RemoveFile(file2);
  cmSystemTools::RemoveFile(file3);
  cmSystemTools::RemoveFile(file4);
  cmSystemTools::RemoveFile(file1tmp);
  cmSystemTools::RemoveFile(file2tmp);
  cmSystemTools::RemoveFile(file3tmp);
  cmSystemTools::RemoveFile(file4tmp);

  return failed;
}